

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS ref_mpi_stopwatch_delta(REF_MPI ref_mpi,REF_DBL *delta)

{
  clock_t cVar1;
  
  cVar1 = clock();
  *delta = (double)cVar1 / 1000000.0 - ref_mpi->start_time;
  ref_mpi_stopwatch_start(ref_mpi);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_stopwatch_delta(REF_MPI ref_mpi, REF_DBL *delta) {
#ifdef HAVE_MPI
  REF_DBL after_barrier;
  if (ref_mpi_para(ref_mpi)) MPI_Barrier(ref_mpi_comm(ref_mpi));
  after_barrier = (REF_DBL)MPI_Wtime();
  after_barrier = after_barrier - ref_mpi->start_time;
  RSS(ref_mpi_min(ref_mpi, &after_barrier, delta, REF_DBL_TYPE), "max");
  RSS(ref_mpi_stopwatch_start(ref_mpi), "restart");
#else
  clock_t ticks;
  ticks = clock();
  *delta = ((REF_DBL)ticks) / ((REF_DBL)CLOCKS_PER_SEC) - ref_mpi->start_time;
  RSS(ref_mpi_stopwatch_start(ref_mpi), "restart");
#endif

  return REF_SUCCESS;
}